

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int SetMotorPWMRequestRPLIDARx(RPLIDAR *pRPLIDAR,int pwm)

{
  int iVar1;
  int i;
  long lVar2;
  ssize_t sVar3;
  uchar res;
  uint uVar4;
  ulong uVar5;
  uchar reqbuf [6];
  undefined3 local_28;
  undefined1 uStack_25;
  undefined1 uStack_24;
  byte bStack_23;
  timespec local_20;
  
  _local_28 = CONCAT13((char)pwm,0x2f0a5);
  uStack_24 = (undefined1)((uint)pwm >> 8);
  lVar2 = 0;
  bStack_23 = 0;
  do {
    bStack_23 = bStack_23 ^ *(byte *)((long)&local_28 + lVar2);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    uVar5 = 0;
    do {
      sVar3 = send(iVar1,(void *)((long)&local_28 + uVar5),(long)(6 - (int)uVar5),0);
      if ((int)sVar3 < 1) goto LAB_0010d5f6;
      uVar4 = (int)uVar5 + (int)sVar3;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < 6);
  }
  else {
    if (iVar1 != 0) {
LAB_0010d5f6:
      puts("Error writing data to a RPLIDAR. ");
      return 1;
    }
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar5 = 0;
    do {
      sVar3 = write(iVar1,(void *)((long)&local_28 + uVar5),(ulong)(6 - (int)uVar5));
      if ((int)sVar3 < 1) goto LAB_0010d5f6;
      uVar4 = (int)uVar5 + (int)sVar3;
      uVar5 = (ulong)uVar4;
    } while (uVar4 < 6);
  }
  local_20.tv_sec = 0;
  local_20.tv_nsec = 500000000;
  nanosleep(&local_20,(timespec *)0x0);
  return 0;
}

Assistant:

HARDWAREX_API int SetMotorPWMRequestRPLIDARx(RPLIDAR* pRPLIDAR, int pwm)
{
	return SetMotorPWMRequestRPLIDAR(pRPLIDAR, pwm);
}